

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_cl_kernels.cxx
# Opt level: O2

bool __thiscall
OpenCLKernels::runKernelCalculateFilteredDiff
          (OpenCLKernels *this,UMat *src_diff,uint threshold_1,uint threshold_2,UMat *filtered_diff,
          string *error)

{
  bool bVar1;
  char cVar2;
  Kernel *pKVar3;
  uint threshold_2_local;
  uint threshold_1_local;
  Queue local_b0 [8];
  size_t global_size [2];
  size_t local_size [2];
  KernelArg local_80 [40];
  KernelArg local_58 [40];
  
  threshold_2_local = threshold_2;
  threshold_1_local = threshold_1;
  bVar1 = isAvailable(this,error);
  if (bVar1) {
    global_size[0] = (size_t)*(int *)(src_diff + 0xc);
    global_size[1] = (size_t)*(int *)(src_diff + 8);
    local_size[0] = 0x10;
    local_size[1] = 0x10;
    std::mutex::lock(&this->kernel_calculate_filtered_diff_guard);
    cv::ocl::KernelArg::ReadOnly(local_58,src_diff,1,1);
    cv::ocl::KernelArg::WriteOnlyNoSize(local_80,filtered_diff,1,1);
    pKVar3 = cv::ocl::Kernel::args<cv::ocl::KernelArg,unsigned_int,unsigned_int,cv::ocl::KernelArg>
                       (&this->kernel_calculate_filtered_diff,local_58,&threshold_1_local,
                        &threshold_2_local,local_80);
    cv::ocl::Queue::Queue(local_b0);
    cVar2 = cv::ocl::Kernel::run
                      ((int)pKVar3,(ulong *)0x2,global_size,SUB81(local_size,0),(Queue *)0x1);
    cv::ocl::Queue::~Queue(local_b0);
    pthread_mutex_unlock((pthread_mutex_t *)&this->kernel_calculate_filtered_diff_guard);
    if (cVar2 == '\0') {
      std::__cxx11::string::assign((char *)error);
    }
  }
  else {
    cVar2 = '\0';
  }
  return (bool)cVar2;
}

Assistant:

bool
OpenCLKernels::runKernelCalculateFilteredDiff(const UMat &src_diff, unsigned int threshold_1, unsigned int threshold_2,
                                              UMat &filtered_diff, std::string &error)
{
    if(!isAvailable(error)) {
        return false;
    }

    size_t global_size[2] = {(size_t) src_diff.cols, (size_t) src_diff.rows};
    size_t local_size[2] = {16, 16};
    bool execution_result;
    {
        scoped_lock<mutex> lock(kernel_calculate_filtered_diff_guard);
        execution_result = kernel_calculate_filtered_diff.args(
                cv::ocl::KernelArg::ReadOnly(src_diff),
                threshold_1,
                threshold_2,
                cv::ocl::KernelArg::WriteOnlyNoSize(filtered_diff)
        ).run(2, global_size, local_size, true);
    }
    if(!execution_result) {
        error = "OpenCL kernel: kernel_calculate_filtered_diff launch failed.";
        return false;
    }

    return true;
}